

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

char * __thiscall Pathie::Path::basename(Path *this,char *__filename)

{
  bool bVar1;
  long lVar2;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __filename,".");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_98,".",&local_b9);
    Path(this,&local_98);
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __filename,"..");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_b8,"..",&local_b9);
      Path(this,&local_b8);
      std::__cxx11::string::_M_dispose();
    }
    else {
      if ((*(long *)(__filename + 8) == 1) && (**(char **)__filename == '/')) {
        std::__cxx11::string::string((string *)&local_38,(string *)__filename);
        Path(this,&local_38);
      }
      else {
        lVar2 = std::__cxx11::string::rfind(__filename,0x10f18c);
        if (lVar2 == -1) {
          std::__cxx11::string::string((string *)&local_78,(string *)__filename);
          Path(this,&local_78);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)__filename);
          Path(this,&local_58);
        }
      }
      std::__cxx11::string::_M_dispose();
    }
  }
  return (char *)this;
}

Assistant:

Path Path::basename() const
{
  if (m_path == ".")
    return Path(".");
  else if (m_path == "..")
    return Path("..");
  else if (is_root())
    return Path(m_path);

  size_t pos = 0;
  if ((pos = m_path.rfind("/")) != string::npos) // Single = intended
    return Path(m_path.substr(pos + 1));
  else
    return Path(m_path);
}